

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O1

ptrlen BinarySource_get_chars_internal(BinarySource *src,char *set,_Bool include)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  ptrlen pVar7;
  
  pvVar1 = src->data;
  sVar2 = src->pos;
  if (src->err == BSE_NO_ERROR) {
    sVar3 = src->len;
    sVar4 = src->pos;
    while (sVar6 = sVar4 + 1, sVar6 - sVar3 != 1) {
      pcVar5 = strchr(set,(int)*(char *)((long)pvVar1 + sVar4));
      if ((pcVar5 == (char *)0x0) == include) goto LAB_0016d68e;
      src->pos = sVar6;
      sVar4 = sVar6;
    }
    src->err = BSE_OUT_OF_DATA;
  }
LAB_0016d68e:
  pVar7.len = src->pos - sVar2;
  pVar7.ptr = (void *)((long)pvVar1 + sVar2);
  return pVar7;
}

Assistant:

static ptrlen BinarySource_get_chars_internal(
    BinarySource *src, const char *set, bool include)
{
    const char *start = here;
    while (avail(1)) {
        bool present = NULL != strchr(set, *(const char *)consume(0));
        if (present != include)
            break;
        (void) consume(1);
    }
    const char *end = here;
    return make_ptrlen(start, end - start);
}